

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnStructType
          (BinaryReaderLogging *this,Index index,Index field_count,TypeMut *fields)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 uVar3;
  Enum EVar4;
  TypeMut *pTVar5;
  TypeMut field;
  uint local_2c;
  Index i;
  TypeMut *fields_local;
  Index field_count_local;
  Index index_local;
  BinaryReaderLogging *this_local;
  
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnStructType(index: %u, fields: ",(ulong)index);
  Stream::Writef(this->stream_,"[");
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    pTVar5 = fields + local_2c;
    uVar1 = (pTVar5->type).enum_;
    uVar2 = (pTVar5->type).type_index_;
    field.type.type_index_ = uVar2;
    field.type.enum_ = uVar1;
    uVar3 = pTVar5->mutable_;
    field.mutable_ = (bool)uVar3;
    field._9_3_ = 0;
    LogField(this,field);
    if (local_2c != field_count - 1) {
      Stream::Writef(this->stream_,", ");
    }
  }
  Stream::Writef(this->stream_,"])\n");
  EVar4 = (*this->reader_->_vptr_BinaryReaderDelegate[0xc])
                    (this->reader_,(ulong)index,(ulong)field_count,fields);
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderLogging::OnStructType(Index index,
                                         Index field_count,
                                         TypeMut* fields) {
  LOGF("OnStructType(index: %" PRIindex ", fields: ", index);
  LOGF_NOINDENT("[");
  for (Index i = 0; i < field_count; ++i) {
    LogField(fields[i]);
    if (i != field_count - 1) {
      LOGF_NOINDENT(", ");
    }
  }
  LOGF_NOINDENT("])\n");
  return reader_->OnStructType(index, field_count, fields);
}